

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O2

Up __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoOptWithIntSelType
          (DtFromPseudoRootDtConverter *this,PseudoDt *pseudoDt)

{
  unsigned_long_long *this_00;
  _Rb_tree_header *p_Var1;
  char cVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  PseudoOptWithIntSelType *in_RDX;
  _Head_base<0UL,_const_yactfr::DataType_*,_false> _Var5;
  set<yactfr::IntegerRange<unsigned_long_long,_true>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
  newRanges;
  _tPseudoDtSels selLocPseudoDtsPair;
  undefined1 local_164 [4];
  undefined1 local_160 [8];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Rb_tree_header *local_128;
  __node_base local_120;
  _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
  local_118;
  _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
  local_e8;
  _Rb_tree<yactfr::IntegerRange<long_long,_true>,_yactfr::IntegerRange<long_long,_true>,_std::_Identity<yactfr::IntegerRange<long_long,_true>_>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
  local_b8;
  _tPseudoDtSels local_88;
  
  if (*(int *)((pseudoDt->_loc)._lineNumber + 8) != 2) {
    __assert_fail("_pseudoTraceType->majorVersion() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                  ,0x3ef,
                  "DataType::Up yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoOptWithIntSelType(const PseudoDt &)"
                 );
  }
  std::__cxx11::string::string((string *)local_148,"optional",(allocator *)&local_118);
  _pseudoDtIntSels<yactfr::internal::PseudoOptWithIntSelType>
            (&local_88,(DtFromPseudoRootDtConverter *)pseudoDt,in_RDX,(string *)local_148);
  std::__cxx11::string::~string((string *)local_148);
  this_00 = &(pseudoDt->_posInScope).super_type.m_storage;
  pmVar3 = std::__detail::
           _Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)local_148);
  *pmVar3 = 0;
  _dtFromPseudoDt((DtFromPseudoRootDtConverter *)local_158,pseudoDt);
  std::
  _Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase((_Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)this_00);
  if (local_88.second._M_h._M_element_count != 0) {
    local_158._8_8_ = this;
    cVar2 = (*(code *)(local_88.second._M_h._M_before_begin._M_nxt[1]._M_nxt)->_M_nxt[7]._M_nxt)();
    if (cVar2 == '\0') {
      p_Var1 = (_Rb_tree_header *)(local_148 + 8);
      local_148._8_4_ = _S_red;
      local_138._M_allocated_capacity = 0;
      local_120._M_nxt = (_Hash_node_base *)0x0;
      local_138._8_8_ = p_Var1;
      local_128 = p_Var1;
      for (p_Var4 = (in_RDX->_selRanges)._ranges._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left;
          (_Rb_tree_header *)p_Var4 !=
          &(in_RDX->_selRanges)._ranges._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        IntegerRange<long_long,_true>::IntegerRange
                  ((IntegerRange<long_long,_true> *)&local_118,*(longlong *)(p_Var4 + 1),
                   (longlong)p_Var4[1]._M_parent);
        std::
        _Rb_tree<yactfr::IntegerRange<long_long,true>,yactfr::IntegerRange<long_long,true>,std::_Identity<yactfr::IntegerRange<long_long,true>>,std::less<yactfr::IntegerRange<long_long,true>>,std::allocator<yactfr::IntegerRange<long_long,true>>>
        ::_M_insert_unique<yactfr::IntegerRange<long_long,true>>
                  ((_Rb_tree<yactfr::IntegerRange<long_long,true>,yactfr::IntegerRange<long_long,true>,std::_Identity<yactfr::IntegerRange<long_long,true>>,std::less<yactfr::IntegerRange<long_long,true>>,std::allocator<yactfr::IntegerRange<long_long,true>>>
                    *)local_148,(IntegerRange<long_long,_true> *)&local_118);
      }
      local_164 = (undefined1  [4])0x1;
      std::_Rb_tree_header::_Rb_tree_header(&local_b8._M_impl.super__Rb_tree_header,p_Var1);
      std::
      _Rb_tree<yactfr::IntegerRange<long_long,_true>,_yactfr::IntegerRange<long_long,_true>,_std::_Identity<yactfr::IntegerRange<long_long,_true>_>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
      ::_Rb_tree((_Rb_tree<yactfr::IntegerRange<long_long,_true>,_yactfr::IntegerRange<long_long,_true>,_std::_Identity<yactfr::IntegerRange<long_long,_true>_>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
                  *)&local_118,&local_b8);
      tryCloneAttrs((MapItem *)local_160);
      _Var5._M_head_impl = (DataType *)local_158._8_8_;
      std::
      make_unique<yactfr::OptionalWithSignedIntegerSelectorType_const,int,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::DataLocation,yactfr::IntegerRangeSet<long_long,true>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
                ((int *)&local_e8,
                 (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *
                 )local_164,(DataLocation *)local_158,(IntegerRangeSet<long_long,_true> *)&local_88,
                 (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                 &local_118);
      (_Var5._M_head_impl)->_vptr_DataType = local_e8._M_impl._0_8_;
      local_e8._M_impl._0_8_ = 0;
      std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::
      ~unique_ptr((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                  local_160);
      std::
      _Rb_tree<yactfr::IntegerRange<long_long,_true>,_yactfr::IntegerRange<long_long,_true>,_std::_Identity<yactfr::IntegerRange<long_long,_true>_>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
      ::~_Rb_tree((_Rb_tree<yactfr::IntegerRange<long_long,_true>,_yactfr::IntegerRange<long_long,_true>,_std::_Identity<yactfr::IntegerRange<long_long,_true>_>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
                   *)&local_118);
      std::
      _Rb_tree<yactfr::IntegerRange<long_long,_true>,_yactfr::IntegerRange<long_long,_true>,_std::_Identity<yactfr::IntegerRange<long_long,_true>_>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
      ::~_Rb_tree(&local_b8);
      std::
      _Rb_tree<yactfr::IntegerRange<long_long,_true>,_yactfr::IntegerRange<long_long,_true>,_std::_Identity<yactfr::IntegerRange<long_long,_true>_>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
      ::~_Rb_tree((_Rb_tree<yactfr::IntegerRange<long_long,_true>,_yactfr::IntegerRange<long_long,_true>,_std::_Identity<yactfr::IntegerRange<long_long,_true>_>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
                   *)local_148);
    }
    else {
      local_164 = (undefined1  [4])0x1;
      p_Var1 = (_Rb_tree_header *)(local_148 + 8);
      local_148._8_4_ = _S_red;
      local_138._M_allocated_capacity = 0;
      local_120._M_nxt = (_Hash_node_base *)0x0;
      local_138._8_8_ = p_Var1;
      local_128 = p_Var1;
      for (p_Var4 = (in_RDX->_selRanges)._ranges._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left;
          (_Rb_tree_header *)p_Var4 !=
          &(in_RDX->_selRanges)._ranges._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        IntegerRange<unsigned_long_long,_true>::IntegerRange
                  ((IntegerRange<unsigned_long_long,_true> *)&local_118,
                   *(unsigned_long_long *)(p_Var4 + 1),(unsigned_long_long)p_Var4[1]._M_parent);
        std::
        _Rb_tree<yactfr::IntegerRange<unsigned_long_long,true>,yactfr::IntegerRange<unsigned_long_long,true>,std::_Identity<yactfr::IntegerRange<unsigned_long_long,true>>,std::less<yactfr::IntegerRange<unsigned_long_long,true>>,std::allocator<yactfr::IntegerRange<unsigned_long_long,true>>>
        ::_M_insert_unique<yactfr::IntegerRange<unsigned_long_long,true>>
                  ((_Rb_tree<yactfr::IntegerRange<unsigned_long_long,true>,yactfr::IntegerRange<unsigned_long_long,true>,std::_Identity<yactfr::IntegerRange<unsigned_long_long,true>>,std::less<yactfr::IntegerRange<unsigned_long_long,true>>,std::allocator<yactfr::IntegerRange<unsigned_long_long,true>>>
                    *)local_148,(IntegerRange<unsigned_long_long,_true> *)&local_118);
      }
      std::_Rb_tree_header::_Rb_tree_header(&local_118._M_impl.super__Rb_tree_header,p_Var1);
      std::
      _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
      ::_Rb_tree(&local_e8,&local_118);
      std::
      _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
      ::~_Rb_tree(&local_118);
      std::
      _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
      ::~_Rb_tree((_Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
                   *)local_148);
      tryCloneAttrs((MapItem *)local_148);
      _Var5._M_head_impl = (DataType *)local_158._8_8_;
      std::
      make_unique<yactfr::OptionalWithUnsignedIntegerSelectorType_const,int,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::DataLocation,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
                ((int *)local_160,
                 (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *
                 )local_164,(DataLocation *)local_158,
                 (IntegerRangeSet<unsigned_long_long,_true> *)&local_88,
                 (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                 &local_e8);
      *(undefined1 (*) [8])_Var5._M_head_impl = local_160;
      local_160 = (undefined1  [8])0x0;
      std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::
      ~unique_ptr((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                  local_148);
      std::
      _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
      ::~_Rb_tree(&local_e8);
    }
    if ((tuple<const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>)
        local_158._0_8_ != (_Head_base<0UL,_const_yactfr::StructureType_*,_false>)0x0) {
      (*(((CompoundDataType *)local_158._0_8_)->super_DataType)._vptr_DataType[1])();
    }
    std::
    pair<yactfr::DataLocation,_std::unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>_>
    ::~pair(&local_88);
    return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )(tuple<const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>)
             _Var5._M_head_impl;
  }
  __assert_fail("!pseudoSelDts.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                ,0x3fa,
                "DataType::Up yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoOptWithIntSelType(const PseudoDt &)"
               );
}

Assistant:

DataType::Up DtFromPseudoRootDtConverter::_dtFromPseudoOptWithIntSelType(const PseudoDt& pseudoDt)
{
    assert(_pseudoTraceType->majorVersion() == 2);

    auto& pseudoOptType = static_cast<const PseudoOptWithIntSelType&>(pseudoDt);
    auto selLocPseudoDtsPair = this->_pseudoDtIntSels(pseudoOptType, "optional");
    auto& selLoc = selLocPseudoDtsPair.first;
    const auto& pseudoSelDts = selLocPseudoDtsPair.second;

    auto containedDt = this->_whileVisitingPseudoDt(pseudoOptType, [this](auto& pseudoOptType) {
        return this->_dtFromPseudoDt(pseudoOptType.pseudoDt());
    });

    assert(!pseudoSelDts.empty());

    if ((*pseudoSelDts.begin())->isUInt()) {
        return OptionalWithUnsignedIntegerSelectorType::create(1, std::move(containedDt),
                                                               std::move(selLoc),
                                                               uIntRangeSetFromUIntRangeSetWithoutPrecondsCheck(pseudoOptType.selRanges()),
                                                               tryCloneAttrs(pseudoOptType.attrs()));
    } else {
        using SInt = long long;

        std::set<IntegerRange<SInt>> ranges;

        for (auto& range : pseudoOptType.selRanges()) {
            ranges.insert(IntegerRange<SInt> {
                static_cast<SInt>(range.lower()),
                static_cast<SInt>(range.upper())
            });
        }

        return OptionalWithSignedIntegerSelectorType::create(1, std::move(containedDt),
                                                             std::move(selLoc),
                                                             IntegerRangeSet<SInt> {std::move(ranges)},
                                                             tryCloneAttrs(pseudoOptType.attrs()));
    }

    return nullptr;
}